

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O2

bool cfd::core::Transaction::CheckTxOutBuffer
               (uint8_t *buffer,size_t buf_size,uint64_t txout_num,size_t txout_num_size,
               void *tx_pointer,
               vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *txout_list)

{
  uint64_t *puVar1;
  ulong uVar2;
  uint64_t satoshi;
  bool bVar3;
  CfdException *this;
  ulong data_size;
  ulong uVar4;
  uchar *script;
  Amount AVar5;
  uint64_t script_size;
  long local_130;
  uint64_t local_128;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *local_120;
  wally_tx *local_118;
  long local_110;
  size_t vnum_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_array;
  Amount local_e0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  TxOut out;
  int ret;
  
  local_130 = buf_size - txout_num_size;
  if (buf_size < txout_num_size || local_130 == 0) {
    bVar3 = false;
  }
  else {
    uVar4 = 0;
    local_128 = txout_num;
    local_120 = txout_list;
    local_118 = (wally_tx *)tx_pointer;
    for (local_110 = 0; (local_128 != uVar4 && (8 < (ulong)(local_130 - local_110)));
        local_110 = local_110 + uVar2 + 8) {
      puVar1 = (uint64_t *)(buffer + local_110 + txout_num_size);
      satoshi = *puVar1;
      script_size = 0;
      data_size = (local_130 - local_110) - 8;
      vnum_size = 0;
      bVar3 = AbstractTransaction::GetVariableInt
                        ((uint8_t *)(puVar1 + 1),data_size,&script_size,&vnum_size);
      if ((!bVar3) || (uVar2 = script_size + vnum_size, data_size < uVar2)) break;
      script = (uchar *)((long)(puVar1 + 1) + vnum_size);
      if ((local_118 != (wally_tx *)0x0) &&
         (ret = wally_tx_add_raw_output(local_118,satoshi,script,script_size,0), ret != 0)) {
        out.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x4f054b;
        out.super_AbstractTxOut.value_.amount_._0_4_ = 0x10f;
        out.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_397ee5;
        logger::warn<int&>((CfdSourceLocation *)&out,"wally_tx_add_raw_output NG[{}].",&ret);
        this = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string((string *)&out,"vout add error.",(allocator *)&byte_array);
        CfdException::CfdException(this,kCfdIllegalStateError,(string *)&out);
        __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
      }
      if (local_120 != (vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)0x0) {
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_array,script_size,
                   (allocator_type *)&out.super_AbstractTxOut);
        memcpy(byte_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,script,
               (long)byte_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)byte_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
        AVar5 = Amount::CreateBySatoshiAmount(satoshi);
        local_e0.amount_ = AVar5.amount_;
        local_e0.ignore_check_ = AVar5.ignore_check_;
        ByteData::ByteData((ByteData *)&local_d0,&byte_array);
        Script::Script((Script *)&ret,(ByteData *)&local_d0);
        TxOut::TxOut((TxOut *)&out.super_AbstractTxOut,&local_e0,(Script *)&ret);
        Script::~Script((Script *)&ret);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_d0)
        ;
        ::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::push_back
                  (local_120,(value_type *)&out.super_AbstractTxOut);
        AbstractTxOut::~AbstractTxOut(&out.super_AbstractTxOut);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&byte_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      }
      uVar4 = uVar4 + 1;
    }
    bVar3 = local_130 == local_110 && local_128 <= uVar4;
  }
  return bVar3;
}

Assistant:

bool Transaction::CheckTxOutBuffer(
    const uint8_t *buffer, size_t buf_size, uint64_t txout_num,
    size_t txout_num_size, void *tx_pointer, std::vector<TxOut> *txout_list) {
  bool is_success = false;
  if (buf_size > txout_num_size) {
    size_t data_size = buf_size - txout_num_size;
    size_t offset = 0;
    const uint8_t *address_pointer = buffer;
    address_pointer += txout_num_size;
    bool is_error = false;
    for (uint64_t index = 0; index < txout_num; ++index) {
      const uint8_t *work_address = &address_pointer[offset];
      size_t limit = data_size - offset;
      size_t total = 0;
      // check for value
      if (limit <= sizeof(int64_t)) {
        is_error = true;
        break;
      }
      uint64_t amount;
      memcpy(&amount, work_address, sizeof(amount));
      work_address += sizeof(uint64_t);
      limit -= sizeof(uint64_t);
      total += sizeof(uint64_t);
      // Check locking script
      uint64_t script_size = 0;
      size_t vnum_size = 0;
      if (!GetVariableInt(work_address, limit, &script_size, &vnum_size)) {
        is_error = true;
        break;
      } else if (limit < (vnum_size + script_size)) {
        is_error = true;
        break;
      }
      work_address += vnum_size;
      total += vnum_size + script_size;
      offset += total;

      // Copy of TxOut
      if (tx_pointer != NULL) {
        int ret = wally_tx_add_raw_output(
            static_cast<struct wally_tx *>(tx_pointer), amount, work_address,
            script_size, 0);
        if (ret != WALLY_OK) {
          warn(CFD_LOG_SOURCE, "wally_tx_add_raw_output NG[{}].", ret);
          throw CfdException(kCfdIllegalStateError, "vout add error.");
        }
      }
      if (txout_list != nullptr) {
        std::vector<uint8_t> byte_array(script_size);
        memcpy(byte_array.data(), work_address, byte_array.size());
        TxOut out(
            Amount::CreateBySatoshiAmount(amount),
            Script(ByteData(byte_array)));
        txout_list->push_back(out);
      }
    }

    if ((!is_error) && (data_size == offset)) {
      is_success = true;
    }
  }
  return is_success;
}